

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_SessionFoundHelper::RunImpl
          (initiatorFixtureLookUpSession_SessionFoundHelper *this)

{
  TestResults *this_00;
  long lVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  string delimSOH;
  string header;
  TestDetails TStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  initiatorFixture::startLoggedOn(&this->super_initiatorFixture);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"\x01",(allocator<char> *)&local_108);
  std::operator+(&local_e8,"8=FIX.4.2",&local_128);
  std::operator+(&local_c8,&local_e8,"9=100");
  std::operator+(&local_a8,&local_c8,&local_128);
  std::operator+(&local_88,&local_a8,"35=A");
  std::operator+(&local_68,&local_88,&local_128);
  std::operator+(&local_48,&local_68,"49=TW");
  std::operator+(&local_28,&local_48,&local_128);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_148,
                 &local_28,"56=ISLD");
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_148,
                 &local_128);
  std::__cxx11::string::~string((string *)&TStack_148);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  lVar1 = FIX::Session::lookupSession((string *)&local_108,false);
  if (lVar1 == 0) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_148,*ppTVar3,0xaba);
    UnitTest::TestResults::OnTestFailure(this_00,&TStack_148,"nullptr != actualSession");
  }
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_SessionFound)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "9=100" + delimSOH
      + "35=A" + delimSOH
      + "49=TW" + delimSOH
      + "56=ISLD" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr != actualSession);
}